

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::iterate(BuffersTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ContextType ctxType;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    prepareObjects(this);
    bVar1 = prepareTestSetup(this);
    if (bVar1) {
      bVar1 = testBindingPoint(this,0,this->m_bo_a,"glTransformFeedbackBufferBase");
      bVar2 = testBindingPoint(this,1,this->m_bo_b,"glTransformFeedbackBufferRange");
      bVar3 = testBindingPoint(this,2,this->m_bo_b,"glTransformFeedbackBufferRange");
      bVar4 = testStart(this,0,0,"glTransformFeedbackBufferBase");
      bVar5 = testStart(this,1,0,"glTransformFeedbackBufferRange");
      bVar6 = testStart(this,2,0x100,"glTransformFeedbackBufferRange");
      bVar7 = testSize(this,0,0,"glTransformFeedbackBufferBase");
      bVar8 = testSize(this,1,0x100,"glTransformFeedbackBufferRange");
      bVar9 = testSize(this,2,0x100,"glTransformFeedbackBufferRange");
      bVar1 = ((((bVar5 && bVar6) && bVar7) && bVar8) && bVar9) &&
              ((bVar3 && bVar4) && (bVar1 && bVar2));
    }
    else {
      bVar1 = false;
    }
    clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BuffersTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare function pointers, transform feedback and buffer objects. */
		prepareObjects();

		/* Setup transform feedback object binding points with buffer objects. */
		is_ok = prepareTestSetup();

		/* Continue only if test setup succeeded */
		if (is_ok)
		{
			is_ok &= testBindingPoint(0, m_bo_a, "glTransformFeedbackBufferBase");
			is_ok &= testBindingPoint(1, m_bo_b, "glTransformFeedbackBufferRange");
			is_ok &= testBindingPoint(2, m_bo_b, "glTransformFeedbackBufferRange");

			is_ok &= testStart(0, 0, "glTransformFeedbackBufferBase");
			is_ok &= testStart(1, 0, "glTransformFeedbackBufferRange");
			is_ok &= testStart(2, s_bo_size / 2, "glTransformFeedbackBufferRange");

			is_ok &= testSize(0, 0, "glTransformFeedbackBufferBase");
			is_ok &= testSize(1, s_bo_size / 2, "glTransformFeedbackBufferRange");
			is_ok &= testSize(2, s_bo_size / 2, "glTransformFeedbackBufferRange");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}